

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O1

bool anon_unknown.dwarf_285dd0::compare
               (FrameBuffer *asRead,FrameBuffer *asWritten,Box2i *dataWindow,bool nonfatal)

{
  _Rb_tree_color _Var1;
  int iVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  float fVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  long lVar10;
  uint *puVar11;
  ostream *poVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  Box2i *pBVar16;
  half hVar17;
  int iVar18;
  char local_59;
  long local_58;
  Box2i *local_50;
  FrameBuffer *local_48;
  _Rb_tree_node_base *local_40;
  FrameBuffer *local_38;
  
  local_50 = dataWindow;
  local_48 = asWritten;
  p_Var7 = (_Rb_tree_node_base *)Imf_3_2::FrameBuffer::begin();
  local_38 = asRead;
  p_Var8 = (_Rb_tree_node_base *)Imf_3_2::FrameBuffer::end();
  if (p_Var7 != p_Var8) {
    do {
      local_40 = p_Var7 + 1;
      lVar9 = Imf_3_2::FrameBuffer::find((char *)local_48);
      iVar18 = (local_50->min).y;
      pBVar16 = local_50;
      local_58 = (long)iVar18;
      if (iVar18 <= (local_50->max).y) {
        do {
          iVar18 = (pBVar16->min).x;
          p_Var8 = (_Rb_tree_node_base *)0x8;
          if (iVar18 <= (pBVar16->max).x) {
            lVar13 = (long)iVar18;
            do {
              _Var1 = p_Var7[9]._M_color;
              if (_Var1 == _S_red) {
                p_Var8 = (_Rb_tree_node_base *)0xa;
              }
              else {
                puVar11 = (uint *)((long)&(p_Var7[9]._M_parent)->_M_color +
                                  (long)p_Var7[9]._M_left * lVar13 +
                                  (long)p_Var7[9]._M_right * local_58);
                if (_Var1 == _S_black) {
                  hVar17._h = (uint16_t)*puVar11;
                }
                else {
                  if (_Var1 != 2) goto LAB_001949bf;
                  if ((-(int)puVar11 & 3U) != 0) {
                    __assert_fail("alignToFour (ptr) == ptr",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                                  ,0xe0,
                                  "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                                 );
                  }
                  uVar15 = *puVar11;
                  uVar5 = uVar15 & 0x7fffffff;
                  hVar17._h = (ushort)(uVar15 >> 0x10) & 0x8000;
                  if (uVar5 < 0x38800000) {
                    if ((0x33000000 < uVar5) &&
                       (uVar15 = uVar15 & 0x7fffff | 0x800000, cVar4 = (char)(uVar5 >> 0x17),
                       hVar17._h = hVar17._h | (ushort)(uVar15 >> (0x7eU - cVar4 & 0x1f)),
                       0x80000000 < uVar15 << (cVar4 + 0xa2U & 0x1f))) {
                      hVar17._h = hVar17._h + 1;
                    }
                  }
                  else if (uVar5 < 0x7f800000) {
                    if (uVar5 < 0x477ff000) {
                      hVar17._h = (ushort)(uVar5 + 0x8000fff + (uint)((uVar5 >> 0xd & 1) != 0) >>
                                          0xd) | hVar17._h;
                    }
                    else {
                      hVar17._h = hVar17._h | 0x7c00;
                    }
                  }
                  else {
                    hVar17._h = hVar17._h | 0x7c00;
                    if (uVar5 != 0x7f800000) {
                      uVar15 = uVar5 >> 0xd & 0x3ff;
                      hVar17._h = hVar17._h | (ushort)uVar15 | (ushort)(uVar15 == 0);
                    }
                  }
                }
                lVar10 = Imf_3_2::FrameBuffer::end();
                pBVar16 = local_50;
                if (lVar9 == lVar10) {
                  fVar6 = ABS((float)(double)p_Var7[10]._M_parent);
                  uVar15 = (uint)(float)(double)p_Var7[10]._M_parent >> 0x10 & 0x8000;
                  asRead = (FrameBuffer *)(ulong)uVar15;
                  if ((uint)fVar6 < 0x38800000) {
                    if (0x33000000 < (uint)fVar6) {
                      cVar4 = (char)((uint)fVar6 >> 0x17);
                      uVar5 = (uint)fVar6 & 0x7fffff | 0x800000;
                      uVar15 = uVar15 | uVar5 >> (0x7eU - cVar4 & 0x1f);
                      asRead = (FrameBuffer *)(ulong)uVar15;
                      if (0x80000000 < uVar5 << (cVar4 + 0xa2U & 0x1f)) {
                        asRead = (FrameBuffer *)(ulong)(uVar15 + 1);
                      }
                    }
                  }
                  else if ((uint)fVar6 < 0x7f800000) {
                    if ((uint)fVar6 < 0x477ff000) {
                      asRead = (FrameBuffer *)
                               (ulong)((int)fVar6 + 0x8000fff +
                                       (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd | uVar15);
                    }
                    else {
                      asRead = (FrameBuffer *)(ulong)(uVar15 | 0x7c00);
                    }
                  }
                  else {
                    asRead = (FrameBuffer *)(ulong)(uVar15 | 0x7c00);
                    if (fVar6 != INFINITY) {
                      uVar5 = (uint)fVar6 >> 0xd & 0x3ff;
                      asRead = (FrameBuffer *)(ulong)(uVar15 | 0x7c00 | uVar5 | (uint)(uVar5 == 0));
                    }
                  }
                }
                else {
                  iVar2 = *(int *)(lVar9 + 0x120);
                  if (iVar2 == 0) {
                    p_Var8 = (_Rb_tree_node_base *)0xa;
                    bVar3 = false;
                  }
                  else {
                    puVar11 = (uint *)(*(long *)(lVar9 + 0x130) * lVar13 +
                                      *(long *)(lVar9 + 0x138) * local_58 + *(long *)(lVar9 + 0x128)
                                      );
                    if (iVar2 == 1) {
                      asRead = (FrameBuffer *)(ulong)(ushort)*puVar11;
LAB_001947e0:
                      p_Var8 = (_Rb_tree_node_base *)0x0;
                      bVar3 = true;
                    }
                    else {
                      if (iVar2 != 2) {
LAB_001949bf:
                        std::operator<<((ostream *)&std::cout,"don\'t know about that\n");
                        exit(1);
                      }
                      if ((-(int)puVar11 & 3U) != 0) {
                        __assert_fail("alignToFour (ptr) == ptr",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                                      ,0xf5,
                                      "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                                     );
                      }
                      uVar15 = *puVar11;
                      uVar14 = uVar15 & 0x7fffffff;
                      uVar5 = uVar15 >> 0x10 & 0x8000;
                      asRead = (FrameBuffer *)(ulong)uVar5;
                      if (uVar14 < 0x38800000) {
                        p_Var8 = (_Rb_tree_node_base *)0x0;
                        bVar3 = true;
                        if (0x33000000 < uVar14) {
                          uVar15 = uVar15 & 0x7fffff | 0x800000;
                          cVar4 = (char)(uVar14 >> 0x17);
                          uVar5 = uVar5 | uVar15 >> (0x7eU - cVar4 & 0x1f);
                          asRead = (FrameBuffer *)(ulong)uVar5;
                          if (0x80000000 < uVar15 << (cVar4 + 0xa2U & 0x1f)) {
                            asRead = (FrameBuffer *)(ulong)(uVar5 + 1);
                          }
                        }
                      }
                      else if (uVar14 < 0x7f800000) {
                        if (0x477fefff < uVar14) {
                          asRead = (FrameBuffer *)(ulong)(uVar5 | 0x7c00);
                          goto LAB_001947e0;
                        }
                        p_Var8 = (_Rb_tree_node_base *)0x0;
                        bVar3 = true;
                        asRead = (FrameBuffer *)
                                 (ulong)(uVar14 + 0x8000fff + (uint)((uVar14 >> 0xd & 1) != 0) >>
                                         0xd | uVar5);
                      }
                      else {
                        asRead = (FrameBuffer *)(ulong)(uVar5 | 0x7c00);
                        p_Var8 = (_Rb_tree_node_base *)0x0;
                        bVar3 = true;
                        if (uVar14 != 0x7f800000) {
                          uVar15 = uVar14 >> 0xd & 0x3ff;
                          asRead = (FrameBuffer *)
                                   (ulong)(uVar5 | 0x7c00 | uVar15 | (uint)(uVar15 == 0));
                        }
                      }
                    }
                  }
                  if (!bVar3) goto LAB_0019483d;
                }
                p_Var8 = (_Rb_tree_node_base *)0x0;
                if ((uint16_t)asRead != hVar17._h) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\n\nerror reading back channel ",0x1d);
                  poVar12 = std::operator<<((ostream *)&std::cout,(char *)local_40);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12," pixel ",7);
                  poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar18);
                  local_59 = ',';
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,&local_59,1);
                  poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)local_58);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12," got ",5);
                  poVar12 = (ostream *)::operator<<(poVar12,hVar17);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12," expected ",10);
                  poVar12 = (ostream *)::operator<<(poVar12,(half)(uint16_t)asRead);
                  std::endl<char,std::char_traits<char>>(poVar12);
                  __assert_fail("writtenHalf.bits () == readHalf.bits ()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimizedInterleavePatterns.cpp"
                                ,0x10c,
                                "bool (anonymous namespace)::compare(const FrameBuffer &, const FrameBuffer &, const Box2i &, bool)"
                               );
                }
              }
LAB_0019483d:
              if (((int)p_Var8 != 10) && ((int)p_Var8 != 0)) goto LAB_00194964;
              iVar18 = iVar18 + 1;
              bVar3 = lVar13 < (pBVar16->max).x;
              lVar13 = lVar13 + 1;
            } while (bVar3);
            p_Var8 = (_Rb_tree_node_base *)0x8;
          }
LAB_00194964:
          if ((int)p_Var8 != 8) goto LAB_00194989;
          lVar13 = local_58 + 1;
          bVar3 = local_58 < (pBVar16->max).y;
          local_58 = lVar13;
        } while (bVar3);
      }
      p_Var8 = (_Rb_tree_node_base *)0x5;
LAB_00194989:
      if (((int)p_Var8 != 5) && ((int)p_Var8 != 0)) break;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      p_Var8 = (_Rb_tree_node_base *)Imf_3_2::FrameBuffer::end();
    } while (p_Var7 != p_Var8);
  }
  return SUB81(p_Var8,0);
}

Assistant:

bool
compare (
    const FrameBuffer& asRead,
    const FrameBuffer& asWritten,
    const Box2i&       dataWindow,
    bool               nonfatal)
{
    for (FrameBuffer::ConstIterator i = asRead.begin (); i != asRead.end ();
         i++)
    {
        FrameBuffer::ConstIterator p = asWritten.find (i.name ());
        for (int y = dataWindow.min.y; y <= dataWindow.max.y; y++)
        {
            for (int x = dataWindow.min.x; x <= dataWindow.max.x; x++)

            {
                //
                // extract value read back from file
                //
                intptr_t base = reinterpret_cast<intptr_t> (i.slice ().base);
                char*    ptr  = reinterpret_cast<char*> (
                    base + i.slice ().yStride * intptr_t (y) +
                    i.slice ().xStride * intptr_t (x));
                half readHalf;
                switch (i.slice ().type)
                {
                    case IMF::FLOAT:
                        assert (alignToFour (ptr) == ptr);
                        readHalf = half (*(float*) ptr);
                        break;
                    case IMF::HALF: readHalf = half (*(half*) ptr); break;
                    case IMF::UINT: continue; // can't very well check this
                    default: cout << "don't know about that\n"; exit (1);
                }

                half writtenHalf;

                if (p != asWritten.end ())
                {

                    intptr_t base =
                        reinterpret_cast<intptr_t> (p.slice ().base);
                    char* ptr = reinterpret_cast<char*> (
                        base + p.slice ().yStride * intptr_t (y) +
                        p.slice ().xStride * intptr_t (x));
                    switch (p.slice ().type)
                    {
                        case IMF::FLOAT:
                            assert (alignToFour (ptr) == ptr);
                            writtenHalf = half (*(float*) ptr);
                            break;
                        case IMF::HALF:
                            writtenHalf = half (*(half*) ptr);
                            break;
                        case IMF::UINT: continue;
                        default: cout << "don't know about that\n"; exit (1);
                    }
                }
                else
                {
                    writtenHalf = half (i.slice ().fillValue);
                }

                if (writtenHalf.bits () != readHalf.bits ())
                {
                    if (nonfatal) { return false; }
                    else
                    {
                        cout << "\n\nerror reading back channel " << i.name ()
                             << " pixel " << x << ',' << y << " got "
                             << readHalf << " expected " << writtenHalf << endl;
                        assert (writtenHalf.bits () == readHalf.bits ());
                        exit (1);
                    }
                }
            }
        }
    }
    return true;
}